

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hr.cc
# Opt level: O0

string * __thiscall OB::Hr::repeat(string *__return_storage_ptr__,Hr *this,size_t len,string *str)

{
  string *psVar1;
  ulong uVar2;
  string *psVar3;
  string local_50 [39];
  undefined1 local_29;
  string *local_28;
  string *str_local;
  size_t len_local;
  Hr *this_local;
  string *res;
  
  local_28 = str;
  str_local = (string *)len;
  len_local = (size_t)this;
  this_local = (Hr *)__return_storage_ptr__;
  if ((len == 0) || (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    psVar3 = (string *)std::__cxx11::string::size();
    psVar1 = str_local;
    if (psVar3 < str_local) {
      local_29 = 0;
      uVar2 = std::__cxx11::string::size();
      String::repeat(__return_storage_ptr__,(ulong)psVar1 / uVar2,local_28);
      psVar3 = (string *)std::__cxx11::string::size();
      psVar1 = local_28;
      if (psVar3 < str_local) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_50,(ulong)psVar1);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_50);
        std::__cxx11::string::~string(local_50);
      }
    }
    else {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Hr::repeat(std::size_t const len, std::string const& str) const
{
  if (len == 0 || str.empty())
  {
    return {};
  }


  if (str.size() >= len)
  {
    return str.substr(0, len);
  }

  std::string res {OB::String::repeat(len / str.size(), str)};

  if (res.size() < len)
  {
    res += str.substr(0, len - res.size());
  }

  return res;
}